

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cc
# Opt level: O1

void __thiscall klogic::mvn::mvn(mvn *this,int k,int N)

{
  int iVar1;
  pointer pcVar2;
  allocator_type local_21;
  double local_20;
  
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&this->weights,(long)(N + 1),&local_21);
  if (-1 < (N | k)) {
    this->k = k;
    for (pcVar2 = (this->weights).
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pcVar2 != (this->weights).
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pcVar2 = pcVar2 + 1) {
      iVar1 = rand();
      local_20 = (double)iVar1 / 2147483647.0;
      iVar1 = rand();
      *(double *)pcVar2->_M_value = local_20;
      *(double *)(pcVar2->_M_value + 8) = (double)iVar1 / 2147483647.0;
    }
    return;
  }
  __assert_fail("k >= 0 && N >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/lib/mvn.cc",10
                ,"klogic::mvn::mvn(int, int)");
}

Assistant:

klogic::mvn::mvn(int k, int N)
    : weights(N + 1)
{
    assert(k >= 0 && N >= 0);
    this->k = k;

    // Randomize weights
    for (cvector::iterator i = weights.begin(); i != weights.end(); ++i)
        *i = cmplx(double(rand()) / RAND_MAX, double(rand()) / RAND_MAX);
}